

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_folding.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::ConstantFoldingRule::Apply
          (ConstantFoldingRule *this,LogicalOperator *op,
          vector<std::reference_wrapper<duckdb::Expression>,_true> *bindings,bool *changes_made,
          bool is_root)

{
  Expression *expr;
  bool bVar1;
  reference pvVar2;
  ClientContext *context;
  BoundConstantExpression *this_00;
  Value result_value;
  LogicalType LStack_b8;
  Value local_a0;
  Value local_60;
  
  pvVar2 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,0);
  expr = pvVar2->_M_data;
  LogicalType::LogicalType(&LStack_b8,SQLNULL);
  Value::Value(&local_a0,&LStack_b8);
  LogicalType::~LogicalType(&LStack_b8);
  context = Rule::GetContext((Rule *)op);
  bVar1 = ExpressionExecutor::TryEvaluateScalar(context,expr,&local_a0);
  if (bVar1) {
    this_00 = (BoundConstantExpression *)operator_new(0x98);
    Value::Value(&local_60,&local_a0);
    BoundConstantExpression::BoundConstantExpression(this_00,&local_60);
    Value::~Value(&local_60);
  }
  else {
    this_00 = (BoundConstantExpression *)0x0;
  }
  (this->super_Rule)._vptr_Rule = (_func_int **)this_00;
  Value::~Value(&local_a0);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> ConstantFoldingRule::Apply(LogicalOperator &op, vector<reference<Expression>> &bindings,
                                                  bool &changes_made, bool is_root) {
	auto &root = bindings[0].get();
	// the root is a scalar expression that we have to fold
	D_ASSERT(root.IsFoldable() && root.GetExpressionType() != ExpressionType::VALUE_CONSTANT);

	// use an ExpressionExecutor to execute the expression
	Value result_value;
	if (!ExpressionExecutor::TryEvaluateScalar(GetContext(), root, result_value)) {
		return nullptr;
	}
	D_ASSERT(result_value.type().InternalType() == root.return_type.InternalType());
	// now get the value from the result vector and insert it back into the plan as a constant expression
	return make_uniq<BoundConstantExpression>(result_value);
}